

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::BlackbodySpectrum::Sample(BlackbodySpectrum *this,SampledWavelengths *lambda)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  array<float,_4> aVar7;
  long lVar8;
  float fVar9;
  SampledSpectrum s;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  fVar2 = this->T;
  fVar3 = this->normalizationFactor;
  lVar8 = 0;
  do {
    fVar9 = 0.0;
    if (0.0 < fVar2) {
      fVar4 = (lambda->lambda).values[lVar8] * 1e-09;
      fVar9 = (1.9864457e-25 / (fVar4 * 1.3806487e-23 * fVar2)) * 1.442695;
      auVar5 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),9);
      fVar9 = fVar9 - auVar5._0_4_;
      auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar9),
                               SUB6416(ZEXT464(0x3e679a0b),0));
      auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar9),SUB6416(ZEXT464(0x3f321004),0));
      auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar9),SUB6416(ZEXT464(0x3f800000),0));
      iVar1 = (int)auVar5._0_4_ + -0x7f + (auVar6._0_4_ >> 0x17);
      fVar9 = -1.0;
      if ((-0x7f < iVar1) && (fVar9 = INFINITY, iVar1 < 0x80)) {
        fVar9 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar6._0_4_ & 0x807fffff) + -1.0;
      }
      fVar9 = 1.1910428e-16 / (fVar4 * fVar4 * fVar4 * fVar4 * fVar4 * fVar9);
      if (NAN(fVar9)) {
        LogFatal<char_const(&)[11]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/spectrum.h"
                   ,0x4b,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
      }
    }
    *(float *)((long)&local_18 + lVar8 * 4) = fVar9 * fVar3;
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      aVar7.values[2] = (float)(undefined4)uStack_10;
      aVar7.values[3] = (float)uStack_10._4_4_;
      aVar7.values[0] = (float)(undefined4)local_18;
      aVar7.values[1] = (float)local_18._4_4_;
      return (array<float,_4>)(array<float,_4>)aVar7.values;
    }
  } while( true );
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = Blackbody(lambda[i], T) * normalizationFactor;
        return s;
    }